

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_details.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_details::~xr_level_details(xr_level_details *this)

{
  this->_vptr_xr_level_details = (_func_int **)&PTR__xr_level_details_00238a50;
  if (this->m_slots != (detail_slot_v3 *)0x0) {
    operator_delete__(this->m_slots);
  }
  delete_elements<std::vector<xray_re::xr_dm*,std::allocator<xray_re::xr_dm*>>>(&this->m_models);
  if (this->m_texture != (xr_image *)0x0) {
    (*this->m_texture->_vptr_xr_image[1])();
  }
  if (this->m_raw_texture != (uint8_t *)0x0) {
    operator_delete__(this->m_raw_texture);
  }
  std::_Vector_base<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>::~_Vector_base
            (&(this->m_models).
              super__Vector_base<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>);
  return;
}

Assistant:

xr_level_details::~xr_level_details()
{
	delete[] m_slots;
	delete_elements(m_models);
	delete m_texture;
	delete[] m_raw_texture;
}